

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O1

int main(int argc,char **argv)

{
  canid_t cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  uint7 uVar7;
  byte bVar8;
  char cVar9;
  char cVar10;
  byte bVar11;
  uchar uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  uint uVar18;
  uint uVar19;
  longlong lVar20;
  ulong uVar21;
  size_t sVar22;
  char *pcVar23;
  ssize_t sVar24;
  int *piVar25;
  __u8 *p_Var26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  uint7 uVar30;
  undefined **ppuVar31;
  undefined8 *puVar32;
  char cVar33;
  byte bVar34;
  bool bVar35;
  bool bVar36;
  byte bVar37;
  timespec ts;
  timespec tVar38;
  uint8_t control [24];
  sockaddr_can addr;
  int loopback;
  iovec iov;
  uchar fixdata [64];
  timeval now;
  ifreq ifr;
  option long_options [3];
  uint local_218;
  size_t local_208;
  ulong local_200;
  double local_1f8;
  byte local_1e8;
  ulong local_1c8;
  ulong local_1a8;
  pollfd local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  long local_188;
  sockaddr local_178;
  undefined8 local_168;
  msghdr local_160;
  iovec local_128;
  __u8 local_118 [8];
  __u8 a_Stack_110 [8];
  __u8 local_108 [8];
  __u8 a_Stack_100 [8];
  __u8 local_f8 [8];
  __u8 a_Stack_f0 [8];
  __u8 local_e8 [8];
  __u8 a_Stack_e0 [16];
  timeval local_d0;
  undefined1 local_c0 [16];
  int local_b0;
  undefined8 local_98 [13];
  
  bVar37 = 0;
  local_178.sa_family = 0;
  local_178.sa_data[0] = '\0';
  local_178.sa_data[1] = '\0';
  local_178.sa_data[2] = '\0';
  local_178.sa_data[3] = '\0';
  local_178.sa_data[4] = '\0';
  local_178.sa_data[5] = '\0';
  local_178.sa_data[6] = '\0';
  local_178.sa_data[7] = '\0';
  local_178.sa_data[8] = '\0';
  local_178.sa_data[9] = '\0';
  local_178.sa_data[10] = '\0';
  local_178.sa_data[0xb] = '\0';
  local_178.sa_data[0xc] = '\0';
  local_178.sa_data[0xd] = '\0';
  local_168 = 0;
  bVar35 = false;
  gettimeofday(&local_d0,(__timezone_ptr_t)0x0);
  srandom((uint)local_d0.tv_usec);
  signal(0xf,sigterm);
  signal(1,sigterm);
  signal(2,sigterm);
  ppuVar31 = &PTR_anon_var_dwarf_625_00107d70;
  puVar32 = local_98;
  for (lVar29 = 0xc; lVar29 != 0; lVar29 = lVar29 + -1) {
    *puVar32 = *ppuVar31;
    ppuVar31 = ppuVar31 + (ulong)bVar37 * -2 + 1;
    puVar32 = puVar32 + (ulong)bVar37 * -2 + 1;
  }
  local_1f8 = 200.0;
  local_1c8 = 1;
  local_1e8 = 0;
  bVar36 = false;
  bVar3 = false;
  iVar14 = 0;
  cVar9 = '\0';
  local_218 = 0;
  cVar10 = '\0';
  bVar5 = false;
  bVar37 = 0;
  bVar8 = 0;
  bVar4 = false;
  local_1a8 = 0;
  bVar11 = 0;
  uVar7 = 0;
switchD_00102a78_caseD_4:
  do {
    while( true ) {
      while( true ) {
        uVar30 = uVar7;
        bVar34 = bVar11;
        iVar13 = getopt_long(argc,argv,"g:atefbER8mI:L:D:p:n:ixc:vh?",local_98);
        bVar11 = bVar34;
        uVar7 = uVar30;
        if (iVar13 < 0x61) break;
        uVar28 = iVar13 - 0x61;
        if (uVar28 < 0x18) goto code_r0x00102a6e;
        if (iVar13 == 0x100) {
          uVar21 = strtoul((char *)_optarg,(char **)0x0,0);
          so_mark_val = (int)uVar21;
        }
        else {
          if (iVar13 != 0x101) goto switchD_00102a78_caseD_3;
          lVar20 = strtoll((char *)_optarg,(char **)0x0,0);
          tVar38.tv_nsec = lVar20 % 1000000000;
          tVar38.tv_sec = lVar20 / 1000000000;
          tVar38 = timespec_normalise(tVar38);
          ::ts = tVar38;
        }
      }
      if (0x43 < iVar13) break;
      if (iVar13 != 0x38) {
        if ((iVar13 == -1) && (lVar29 = (long)_optind, _optind != argc)) {
          ts.tv_sec = (long)(local_1f8 / 1000.0);
          ts.tv_nsec = (long)((local_1f8 / 1000.0 - (double)ts.tv_sec) * 1000000000.0);
          ts_gap = timespec_normalise(ts);
          if ((cVar10 == '\x02' && bVar34 == 0) && 0x7ff < main::frame.can_id) {
            pcVar23 = "The given CAN-ID is greater than 0x7FF and the \'-e\' option is not set.";
            goto LAB_00102e28;
          }
          pcVar23 = argv[lVar29];
          sVar22 = strlen(pcVar23);
          if (0xf < sVar22) {
            printf("Name of CAN device \'%s\' is too long!\n\n",pcVar23);
            goto LAB_00102e2d;
          }
          iVar15 = 1;
          iVar13 = socket(0x1d,3,1);
          if (iVar13 < 0) {
            perror("socket");
            goto LAB_00102e33;
          }
          local_178.sa_family = 0x1d;
          uVar28 = if_nametoindex(argv[_optind]);
          local_178.sa_data._2_4_ = uVar28;
          if (uVar28 == 0) {
            pcVar23 = "if_nametoindex";
            goto LAB_0010371d;
          }
          setsockopt(iVar13,0x65,1,(void *)0x0,0);
          if (bVar35) {
            local_160.msg_name = (void *)((ulong)local_160.msg_name & 0xffffffff00000000);
            setsockopt(iVar13,0x65,3,&local_160,4);
          }
          if (bVar4) {
            local_160.msg_name = (void *)CONCAT44(local_160.msg_name._4_4_,1);
            iVar15 = ioctl(iVar13,0x8921,local_c0);
            if (iVar15 < 0) {
              perror("SIOCGIFMTU");
LAB_00102fa2:
              iVar15 = 1;
              bVar35 = false;
            }
            else {
              if (local_b0 != 0x48) {
                pcVar23 = "CAN interface is not CAN FD capable - sorry.";
LAB_00102f9d:
                puts(pcVar23);
                goto LAB_00102fa2;
              }
              iVar15 = setsockopt(iVar13,0x65,5,&local_160,4);
              if (iVar15 != 0) {
                pcVar23 = "error when enabling CAN FD support";
                goto LAB_00102f9d;
              }
              uVar12 = can_fd_len2dlc(main::frame.len);
              main::frame.len = can_fd_dlc2len(uVar12);
              iVar15 = 0;
              bVar35 = true;
            }
            if (!bVar35) goto LAB_00102e33;
          }
          else {
            if (bVar3) {
              if (0xf < main::frame.len) {
                main::frame.len = '\x0f';
              }
              if (8 < main::frame.len) {
                main::frame.__res1 = main::frame.len;
              }
            }
            if (8 < main::frame.len) {
              main::frame.len = '\b';
            }
          }
          iVar15 = bind(iVar13,&local_178,0x18);
          if (iVar15 < 0) {
            pcVar23 = "bind";
            goto LAB_0010371d;
          }
          if (use_so_txtime == '\x01') {
            iVar16 = setsockopt_txtime(iVar13);
            iVar15 = 1;
            if (iVar16 != 0) goto LAB_00102e33;
          }
          iVar16 = setup_time();
          iVar15 = 1;
          if (iVar16 != 0) goto LAB_00102e33;
          if (running == 0) goto LAB_001036ae;
          iVar15 = 0;
          uVar21 = 0;
          local_200 = 0;
          goto LAB_00103045;
        }
        goto switchD_00102a78_caseD_3;
      }
      bVar3 = true;
    }
    switch(iVar13) {
    case 0x44:
      local_218 = 0;
      if (*_optarg != 0x72) {
        if (*_optarg == 0x69) {
          local_218 = 1;
        }
        else {
          iVar13 = hexstring2data((char *)_optarg,local_118,0x40);
          local_218 = (uint)CONCAT71(uVar30,2);
          if (iVar13 != 0) {
            pcVar23 = "wrong fix data definition";
LAB_00102e28:
            puts(pcVar23);
            goto LAB_00102e2d;
          }
        }
      }
      break;
    case 0x45:
      bVar37 = 1;
      goto switchD_00102a78_caseD_5;
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
      goto switchD_00102a78_caseD_3;
    case 0x49:
      bVar34 = *_optarg;
      if (bVar34 < 0x6f) {
        if (bVar34 == 0x65) {
          cVar10 = '\x03';
          break;
        }
        if (bVar34 == 0x69) {
          cVar10 = '\x01';
          break;
        }
      }
      else {
        if (bVar34 == 0x6f) {
          cVar10 = '\x04';
          break;
        }
        cVar10 = '\0';
        if (bVar34 == 0x72) break;
      }
      uVar21 = strtoul((char *)_optarg,(char **)0x0,0x10);
      main::frame.can_id = (canid_t)uVar21;
      cVar10 = '\x02';
      break;
    case 0x4c:
      cVar9 = '\0';
      if (*_optarg != 0x72) {
        if (*_optarg == 0x69) {
          cVar9 = '\x01';
        }
        else {
          iVar13 = atoi((char *)_optarg);
          main::frame.len = (__u8)iVar13;
          cVar9 = '\x02';
        }
      }
      break;
    default:
      if (iVar13 != 0x52) goto switchD_00102a78_caseD_3;
      bVar36 = true;
    }
  } while( true );
code_r0x00102a6e:
  bVar11 = 1;
  uVar7 = (uint7)(uint3)(uVar28 >> 8);
  switch(uVar28) {
  case 0:
    clock_nanosleep_flags = 1;
    bVar11 = bVar34;
    uVar7 = uVar30;
    goto switchD_00102a78_caseD_4;
  case 1:
    bVar8 = 1;
    break;
  case 2:
    local_1c8 = strtoul((char *)_optarg,(char **)0x0,10);
    bVar11 = bVar34;
    uVar7 = uVar30;
    goto switchD_00102a78_caseD_4;
  default:
    goto switchD_00102a78_caseD_3;
  case 4:
    goto switchD_00102a78_caseD_4;
  case 5:
    break;
  case 6:
    local_1f8 = strtod((char *)_optarg,(char **)0x0);
    bVar11 = bVar34;
    uVar7 = uVar30;
    goto switchD_00102a78_caseD_4;
  case 8:
    ignore_enobufs = 1;
    bVar11 = bVar34;
    uVar7 = uVar30;
    goto switchD_00102a78_caseD_4;
  case 0xc:
    bVar5 = true;
    break;
  case 0xd:
    iVar14 = atoi((char *)_optarg);
    bVar11 = bVar34;
    uVar7 = uVar30;
    if (iVar14 < 1) goto switchD_00102a78_caseD_3;
    goto switchD_00102a78_caseD_4;
  case 0xf:
    local_1a8 = strtoul((char *)_optarg,(char **)0x0,10);
    bVar11 = bVar34;
    uVar7 = uVar30;
    goto switchD_00102a78_caseD_4;
  case 0x13:
    clock_nanosleep_flags = 1;
    use_so_txtime = '\x01';
    bVar11 = bVar34;
    uVar7 = uVar30;
    goto switchD_00102a78_caseD_4;
  case 0x15:
    local_1e8 = local_1e8 + 1;
    bVar11 = bVar34;
    uVar7 = uVar30;
    goto switchD_00102a78_caseD_4;
  case 0x17:
    bVar35 = true;
    bVar11 = bVar34;
    uVar7 = uVar30;
    goto switchD_00102a78_caseD_4;
  }
switchD_00102a78_caseD_5:
  bVar4 = true;
  bVar11 = bVar34;
  uVar7 = uVar30;
  goto switchD_00102a78_caseD_4;
LAB_00103045:
  main::frame.flags = '\0';
  iVar16 = 0;
  if ((iVar14 != 0) && (iVar16 = iVar14 + -1, iVar14 + -1 == 0)) {
    running = 0;
    iVar16 = 0;
  }
  iVar14 = iVar16;
  if (bVar4) {
    main::frame.flags = bVar8 != 0;
    uVar28 = 0x40;
    local_208 = 0x48;
    if (bVar37 != 0) {
      main::frame.flags = main::frame.flags | 2;
    }
  }
  else {
    uVar28 = 8;
    local_208 = 0x10;
  }
  if (cVar10 == '\x04') {
    lVar29 = random();
    main::frame.can_id = (uint)lVar29 | 1;
  }
  else if (cVar10 == '\x03') {
    lVar29 = random();
    main::frame.can_id = (uint)lVar29 & 0xfffffffe;
  }
  else if (cVar10 == '\0') {
    lVar29 = random();
    main::frame.can_id = (canid_t)lVar29;
  }
  cVar1 = main::frame.can_id & 0x1fffffff | 0x80000000;
  if (bVar34 == 0) {
    cVar1 = main::frame.can_id & 0x7ff;
  }
  main::frame.can_id = cVar1 + 0x40000000;
  if (bVar4) {
    main::frame.can_id = cVar1;
  }
  if (!bVar36) {
    main::frame.can_id = cVar1;
  }
  if (cVar9 == '\0') {
    lVar29 = random();
    bVar11 = (byte)lVar29 & 0xf;
    if (bVar4) {
      main::frame.len = can_fd_dlc2len(bVar11);
    }
    else if (bVar11 < 9) {
      main::frame.__res1 = '\0';
      main::frame.len = bVar11;
    }
    else {
      if (bVar3) {
        main::frame.__res1 = bVar11;
      }
      main::frame.len = '\b';
    }
  }
  cVar33 = (char)local_218;
  if ((cVar33 == '\x01') && (main::frame.len == '\0')) {
    main::frame.len = '\x01';
  }
  if (cVar33 == '\x02') {
LAB_001031f0:
    main::frame.data[0x30] = local_e8[0];
    main::frame.data[0x31] = local_e8[1];
    main::frame.data[0x32] = local_e8[2];
    main::frame.data[0x33] = local_e8[3];
    main::frame.data[0x34] = local_e8[4];
    main::frame.data[0x35] = local_e8[5];
    main::frame.data[0x36] = local_e8[6];
    main::frame.data[0x37] = local_e8[7];
    main::frame.data[0x38] = a_Stack_e0[0];
    main::frame.data[0x39] = a_Stack_e0[1];
    main::frame.data[0x3a] = a_Stack_e0[2];
    main::frame.data[0x3b] = a_Stack_e0[3];
    main::frame.data[0x3c] = a_Stack_e0[4];
    main::frame.data[0x3d] = a_Stack_e0[5];
    main::frame.data[0x3e] = a_Stack_e0[6];
    main::frame.data[0x3f] = a_Stack_e0[7];
    main::frame.data[0x20] = local_f8[0];
    main::frame.data[0x21] = local_f8[1];
    main::frame.data[0x22] = local_f8[2];
    main::frame.data[0x23] = local_f8[3];
    main::frame.data[0x24] = local_f8[4];
    main::frame.data[0x25] = local_f8[5];
    main::frame.data[0x26] = local_f8[6];
    main::frame.data[0x27] = local_f8[7];
    main::frame.data[0x28] = a_Stack_f0[0];
    main::frame.data[0x29] = a_Stack_f0[1];
    main::frame.data[0x2a] = a_Stack_f0[2];
    main::frame.data[0x2b] = a_Stack_f0[3];
    main::frame.data[0x2c] = a_Stack_f0[4];
    main::frame.data[0x2d] = a_Stack_f0[5];
    main::frame.data[0x2e] = a_Stack_f0[6];
    main::frame.data[0x2f] = a_Stack_f0[7];
    main::frame.data[0x10] = local_108[0];
    main::frame.data[0x11] = local_108[1];
    main::frame.data[0x12] = local_108[2];
    main::frame.data[0x13] = local_108[3];
    main::frame.data[0x14] = local_108[4];
    main::frame.data[0x15] = local_108[5];
    main::frame.data[0x16] = local_108[6];
    main::frame.data[0x17] = local_108[7];
    main::frame.data[0x18] = a_Stack_100[0];
    main::frame.data[0x19] = a_Stack_100[1];
    main::frame.data[0x1a] = a_Stack_100[2];
    main::frame.data[0x1b] = a_Stack_100[3];
    main::frame.data[0x1c] = a_Stack_100[4];
    main::frame.data[0x1d] = a_Stack_100[5];
    main::frame.data[0x1e] = a_Stack_100[6];
    main::frame.data[0x1f] = a_Stack_100[7];
    main::frame.data[0] = local_118[0];
    main::frame.data[1] = local_118[1];
    main::frame.data[2] = local_118[2];
    main::frame.data[3] = local_118[3];
    main::frame.data[4] = local_118[4];
    main::frame.data[5] = local_118[5];
    main::frame.data[6] = local_118[6];
    main::frame.data[7] = local_118[7];
    main::frame.data[8] = a_Stack_110[0];
    main::frame.data[9] = a_Stack_110[1];
    main::frame.data[10] = a_Stack_110[2];
    main::frame.data[0xb] = a_Stack_110[3];
    main::frame.data[0xc] = a_Stack_110[4];
    main::frame.data[0xd] = a_Stack_110[5];
    main::frame.data[0xe] = a_Stack_110[6];
    main::frame.data[0xf] = a_Stack_110[7];
  }
  else if ((local_218 & 0xff) == 0) {
    lVar29 = random();
    uVar17 = (undefined4)lVar29;
    main::frame.data[0] = (char)uVar17;
    main::frame.data[1] = (char)((uint)uVar17 >> 8);
    main::frame.data[2] = (char)((uint)uVar17 >> 0x10);
    main::frame.data[3] = (char)((uint)uVar17 >> 0x18);
    lVar29 = random();
    uVar17 = (undefined4)lVar29;
    main::frame.data[4] = (__u8)uVar17;
    main::frame.data[5] = (__u8)((uint)uVar17 >> 8);
    main::frame.data[6] = (__u8)((uint)uVar17 >> 0x10);
    main::frame.data[7] = (__u8)((uint)uVar17 >> 0x18);
    uVar6 = main::frame.data._0_8_;
    if ((bVar4) && (8 < main::frame.len)) {
      main::frame.data[8] = main::frame.data[0];
      main::frame.data[9] = main::frame.data[1];
      main::frame.data[10] = main::frame.data[2];
      main::frame.data[0xb] = main::frame.data[3];
      main::frame.data[0xc] = main::frame.data[4];
      main::frame.data[0xd] = main::frame.data[5];
      main::frame.data[0xe] = main::frame.data[6];
      main::frame.data[0xf] = main::frame.data[7];
      main::frame.data[0x10] = main::frame.data[0];
      main::frame.data[0x11] = main::frame.data[1];
      main::frame.data[0x12] = main::frame.data[2];
      main::frame.data[0x13] = main::frame.data[3];
      main::frame.data[0x14] = main::frame.data[4];
      main::frame.data[0x15] = main::frame.data[5];
      main::frame.data[0x16] = main::frame.data[6];
      main::frame.data[0x17] = main::frame.data[7];
      main::frame.data[0x18] = main::frame.data[0];
      main::frame.data[0x19] = main::frame.data[1];
      main::frame.data[0x1a] = main::frame.data[2];
      main::frame.data[0x1b] = main::frame.data[3];
      main::frame.data[0x1c] = main::frame.data[4];
      main::frame.data[0x1d] = main::frame.data[5];
      main::frame.data[0x1e] = main::frame.data[6];
      main::frame.data[0x1f] = main::frame.data[7];
      main::frame.data[0x20] = main::frame.data[0];
      main::frame.data[0x21] = main::frame.data[1];
      main::frame.data[0x22] = main::frame.data[2];
      main::frame.data[0x23] = main::frame.data[3];
      main::frame.data[0x24] = main::frame.data[4];
      main::frame.data[0x25] = main::frame.data[5];
      main::frame.data[0x26] = main::frame.data[6];
      main::frame.data[0x27] = main::frame.data[7];
      main::frame.data[0x28] = main::frame.data[0];
      main::frame.data[0x29] = main::frame.data[1];
      main::frame.data[0x2a] = main::frame.data[2];
      main::frame.data[0x2b] = main::frame.data[3];
      main::frame.data[0x2c] = main::frame.data[4];
      main::frame.data[0x2d] = main::frame.data[5];
      main::frame.data[0x2e] = main::frame.data[6];
      main::frame.data[0x2f] = main::frame.data[7];
      main::frame.data[0x30] = main::frame.data[0];
      main::frame.data[0x31] = main::frame.data[1];
      main::frame.data[0x32] = main::frame.data[2];
      main::frame.data[0x33] = main::frame.data[3];
      main::frame.data[0x34] = main::frame.data[4];
      main::frame.data[0x35] = main::frame.data[5];
      main::frame.data[0x36] = main::frame.data[6];
      main::frame.data[0x37] = main::frame.data[7];
      main::frame.data[0x38] = main::frame.data[0];
      main::frame.data[0x39] = main::frame.data[1];
      main::frame.data[0x3a] = main::frame.data[2];
      main::frame.data[0x3b] = main::frame.data[3];
      main::frame.data[0x3c] = main::frame.data[4];
      main::frame.data[0x3d] = main::frame.data[5];
      main::frame.data[0x3e] = main::frame.data[6];
      main::frame.data[0x3f] = main::frame.data[7];
    }
    main::frame.data._0_8_ = uVar6;
    if (cVar33 == '\x02') goto LAB_001031f0;
  }
  uVar18 = (uint)main::frame.len;
  tVar38 = ::ts;
  if (uVar18 < uVar28) {
    memset(main::frame.data + uVar18,0,(ulong)uVar28 - (ulong)uVar18);
    tVar38 = ::ts;
  }
  ::ts.tv_nsec = tVar38.tv_nsec;
  ::ts.tv_sec = tVar38.tv_sec;
  uVar18 = local_218;
  if (((use_so_txtime == '\0') && (::ts.tv_sec != 0 || ::ts.tv_nsec != 0)) &&
     (local_1c8 <= local_200)) {
    uVar18 = (uint)clock_nanosleep_flags;
    if (uVar18 == 1) {
      ::ts = tVar38;
      tVar38 = timespec_add(tVar38,ts_gap);
    }
    ::ts = tVar38;
    uVar19 = clock_nanosleep(0xb,uVar18,(timespec *)&::ts,(timespec *)0x0);
    tVar38 = ::ts;
    if ((uVar19 & 0xfffffffb) == 0) goto LAB_001032e1;
    pcVar23 = "clock_nanosleep";
LAB_0010371d:
    perror(pcVar23);
  }
  else {
LAB_001032e1:
    ::ts = tVar38;
    if (local_1e8 != 0) {
      printf("  %s  ",argv[_optind]);
      if (local_1e8 == 1) {
        fprint_canframe(_stdout,&main::frame,"\n",1,uVar28);
      }
      else {
        fprint_long_canframe(_stdout,&main::frame,"\n",(uint)(2 < local_1e8),uVar28);
      }
    }
    local_198 = 0;
    uStack_190 = 0;
    local_188 = 0;
    local_128.iov_base = &main::frame;
    local_128.iov_len = local_208;
    local_160.msg_name = (void *)0x0;
    local_160.msg_namelen = 0;
    local_160.msg_iov = &local_128;
    local_160.msg_iovlen = 1;
    local_160.msg_flags = 0;
    local_160.msg_control = (undefined8 *)0x0;
    local_160.msg_controllen = 0;
    tVar38 = ::ts;
    if (use_so_txtime == '\x01') {
      local_160.msg_control = &local_198;
      uVar18 = 0x18;
      local_160.msg_controllen = 0x18;
      lVar29 = ::ts.tv_sec * 1000000000 + ::ts.tv_nsec;
      tVar38 = timespec_add(::ts,ts_gap);
      uStack_190 = 0x3d00000001;
      local_198 = 0x18;
      local_188 = lVar29;
    }
    do {
      ::ts = tVar38;
      sVar24 = sendmsg(iVar13,&local_160,0);
      if (-1 < sVar24) {
        uVar18 = 0;
        tVar38 = ::ts;
        if (sVar24 < (long)local_208) {
          main_cold_1();
LAB_001036a3:
          uVar18 = 0xffffff97;
          tVar38 = ::ts;
        }
        break;
      }
      piVar25 = __errno_location();
      if (*piVar25 != 0x69) {
        uVar18 = -*piVar25;
        perror("write");
        tVar38 = ::ts;
        break;
      }
      iVar16 = (int)local_1a8;
      if ((iVar16 == 0) && ((ignore_enobufs & 1) == 0)) {
        perror("write");
        goto LAB_001036a3;
      }
      if (iVar16 == 0) {
        enobufs_count = enobufs_count + 1;
        uVar18 = 0;
        tVar38 = ::ts;
        break;
      }
      local_1a0.events = 4;
      local_1a0.revents = 0;
      local_1a0.fd = iVar13;
      iVar16 = poll(&local_1a0,1,iVar16);
      bVar35 = true;
      tVar38 = ::ts;
      if (iVar16 == -1) {
        if (*piVar25 != 4) goto LAB_001034c3;
      }
      else if (iVar16 == 0) {
LAB_001034c3:
        bVar35 = false;
        uVar18 = -*piVar25;
        perror("poll");
        tVar38 = ::ts;
      }
    } while (bVar35);
    ::ts = tVar38;
    if (uVar18 == 0) goto code_r0x00103502;
  }
  goto LAB_00102e2d;
code_r0x00103502:
  bVar35 = local_1c8 <= local_200;
  local_200 = local_200 + 1;
  if (bVar35) {
    local_200 = 1;
  }
  if (cVar10 == '\x01') {
    main::frame.can_id = main::frame.can_id + 1;
  }
  if (cVar9 == '\x01') {
    uVar28 = iVar15 + 0x10;
    if (-1 < (int)(iVar15 + 1U)) {
      uVar28 = iVar15 + 1U;
    }
    iVar15 = (iVar15 - (uVar28 & 0xfffffff0)) + 1;
    uVar12 = (uchar)iVar15;
    if (bVar4 && !bVar5) {
      main::frame.len = can_fd_dlc2len(uVar12);
    }
    else if (bVar3) {
      if (iVar15 < 9) {
        main::frame.__res1 = '\0';
        main::frame.len = uVar12;
      }
      else {
        main::frame.len = '\b';
        main::frame.__res1 = uVar12;
      }
    }
    else {
      iVar15 = iVar15 % 9;
      main::frame.len = (__u8)iVar15;
    }
  }
  if (cVar33 == '\x01') {
    uVar21 = uVar21 + 1;
    p_Var26 = main::frame.data;
    lVar29 = 0;
    do {
      *p_Var26 = (__u8)(uVar21 >> ((byte)lVar29 & 0x3f));
      lVar29 = lVar29 + 8;
      p_Var26 = p_Var26 + 1;
    } while (lVar29 != 0x40);
  }
  if (bVar5) {
    uVar27 = random();
    bVar11 = (byte)uVar27;
    bVar34 = bVar11 & 1;
    bVar4 = false;
    bVar2 = bVar11 & 4;
    bVar11 = bVar11 & 8;
    if ((uVar27 & 2) == 0) {
      bVar2 = bVar8;
      bVar11 = bVar37;
    }
    bVar37 = bVar11;
    bVar36 = (~(uint)uVar27 & 0x18) == 0;
    bVar8 = bVar2;
  }
  if (running == 0) goto LAB_001036ae;
  goto LAB_00103045;
LAB_001036ae:
  if (enobufs_count != 0) {
    printf("\nCounted %llu ENOBUFS return values on write().\n\n");
  }
  close(iVar13);
  iVar15 = 0;
  goto LAB_00102e33;
switchD_00102a78_caseD_3:
  pcVar23 = __xpg_basename(*argv);
  print_usage(pcVar23);
LAB_00102e2d:
  iVar15 = 1;
LAB_00102e33:
  return iVar15;
}

Assistant:

int main(int argc, char **argv)
{
	double gap = DEFAULT_GAP;
	unsigned long burst_count = DEFAULT_BURST_COUNT;
	unsigned long polltimeout = 0;
	unsigned char extended = 0;
	unsigned char canfd = 0;
	unsigned char brs = 0;
	unsigned char esi = 0;
	unsigned char mix = 0;
	unsigned char id_mode = MODE_RANDOM;
	unsigned char data_mode = MODE_RANDOM;
	unsigned char dlc_mode = MODE_RANDOM;
	unsigned char loopback_disable = 0;
	unsigned char verbose = 0;
	unsigned char rtr_frame = 0;
	unsigned char len8_dlc = 0;
	int count = 0;
	unsigned long burst_sent_count = 0;
	int mtu, maxdlen;
	uint64_t incdata = 0;
	int incdlc = 0;
	unsigned long rnd;
	unsigned char fixdata[CANFD_MAX_DLEN];

	int opt;
	int s; /* socket */

	struct sockaddr_can addr = { 0 };
	static struct canfd_frame frame;
	struct can_frame *ccf = (struct can_frame *)&frame;
	int i;
	struct ifreq ifr;

	struct timeval now;
	int ret;

	/* set seed value for pseudo random numbers */
	gettimeofday(&now, NULL);
	srandom(now.tv_usec);

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	const struct option long_options[] = {
		{ "mark",	required_argument,	0, OPT_MARK, },
		{ "start",	required_argument,	0, OPT_START, },
		{ 0,		0,			0, 0 },
	};

	while ((opt = getopt_long(argc, argv, "g:atefbER8mI:L:D:p:n:ixc:vh?", long_options, NULL)) != -1) {
		switch (opt) {

		case 'g':
			gap = strtod(optarg, NULL);
			break;

		case 'a':
			clock_nanosleep_flags = TIMER_ABSTIME;
			break;

		case 't':
			clock_nanosleep_flags = TIMER_ABSTIME;
			use_so_txtime = true;
			break;

		case OPT_START: {
			int64_t start_time_ns;

			start_time_ns = strtoll(optarg, NULL, 0);
			ts = ns_to_timespec(start_time_ns);

			break;
		}
		case OPT_MARK:
			so_mark_val = strtoul(optarg, NULL, 0);
			break;
		case 'e':
			extended = 1;
			break;

		case 'f':
			canfd = 1;
			break;

		case 'b':
			brs = 1; /* bitrate switch implies CAN FD */
			canfd = 1;
			break;

		case 'E':
			esi = 1; /* error state indicator implies CAN FD */
			canfd = 1;
			break;

		case 'R':
			rtr_frame = 1;
			break;

		case '8':
			len8_dlc = 1;
			break;

		case 'm':
			mix = 1;
			canfd = 1; /* to switch the socket into CAN FD mode */
			break;

		case 'I':
			if (optarg[0] == 'r') {
				id_mode = MODE_RANDOM;
			} else if (optarg[0] == 'i') {
				id_mode = MODE_INCREMENT;
			} else if (optarg[0] == 'e') {
				id_mode = MODE_RANDOM_EVEN;
			} else if (optarg[0] == 'o') {
				id_mode = MODE_RANDOM_ODD;
			} else {
				id_mode = MODE_FIX;
				frame.can_id = strtoul(optarg, NULL, 16);
			}
			break;

		case 'L':
			if (optarg[0] == 'r') {
				dlc_mode = MODE_RANDOM;
			} else if (optarg[0] == 'i') {
				dlc_mode = MODE_INCREMENT;
			} else {
				dlc_mode = MODE_FIX;
				frame.len = atoi(optarg) & 0xFF; /* is cut to 8 / 64 later */
			}
			break;

		case 'D':
			if (optarg[0] == 'r') {
				data_mode = MODE_RANDOM;
			} else if (optarg[0] == 'i') {
				data_mode = MODE_INCREMENT;
			} else {
				data_mode = MODE_FIX;
				if (hexstring2data(optarg, fixdata, CANFD_MAX_DLEN)) {
					printf("wrong fix data definition\n");
					return 1;
				}
			}
			break;

		case 'p':
			polltimeout = strtoul(optarg, NULL, 10);
			break;

		case 'n':
			count = atoi(optarg);
			if (count < 1) {
				print_usage(basename(argv[0]));
				return 1;
			}
			break;

		case 'i':
			ignore_enobufs = true;
			break;

		case 'x':
			loopback_disable = 1;
			break;

		case 'c':
			burst_count = strtoul(optarg, NULL, 10);
			break;

		case 'v':
			verbose++;
			break;

		case '?':
		case 'h':
		default:
			print_usage(basename(argv[0]));
			return 1;
		}
	}

	if (optind == argc) {
		print_usage(basename(argv[0]));
		return 1;
	}

	ts_gap = double_to_timespec(gap / 1000);

	/* recognize obviously missing commandline option */
	if (id_mode == MODE_FIX && frame.can_id > 0x7FF && !extended) {
		printf("The given CAN-ID is greater than 0x7FF and the '-e' option is not set.\n");
		return 1;
	}

	if (strlen(argv[optind]) >= IFNAMSIZ) {
		printf("Name of CAN device '%s' is too long!\n\n", argv[optind]);
		return 1;
	}

	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[optind]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	/*
	 * disable default receive filter on this RAW socket
	 * This is obsolete as we do not read from the socket at all, but for
	 * this reason we can remove the receive list in the Kernel to save a
	 * little (really a very little!) CPU usage.
	 */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (loopback_disable) {
		const int loopback = 0;

		setsockopt(s, SOL_CAN_RAW, CAN_RAW_LOOPBACK,
			   &loopback, sizeof(loopback));
	}

	if (canfd) {
		const int enable_canfd = 1;

		/* check if the frame fits into the CAN netdevice */
		if (ioctl(s, SIOCGIFMTU, &ifr) < 0) {
			perror("SIOCGIFMTU");
			return 1;
		}

		if (ifr.ifr_mtu != CANFD_MTU) {
			printf("CAN interface is not CAN FD capable - sorry.\n");
			return 1;
		}

		/* interface is ok - try to switch the socket into CAN FD mode */
		if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &enable_canfd, sizeof(enable_canfd))) {
			printf("error when enabling CAN FD support\n");
			return 1;
		}

		/* ensure discrete CAN FD length values 0..8, 12, 16, 20, 24, 32, 64 */
		frame.len = can_fd_dlc2len(can_fd_len2dlc(frame.len));
	} else {
		/* sanitize Classical CAN 2.0 frame length */
		if (len8_dlc) {
			if (frame.len > CAN_MAX_RAW_DLC)
				frame.len = CAN_MAX_RAW_DLC;

			if (frame.len > CAN_MAX_DLEN)
				ccf->len8_dlc = frame.len;
		}

		if (frame.len > CAN_MAX_DLEN)
			frame.len = CAN_MAX_DLEN;
	}

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	if (use_so_txtime) {
		ret = setsockopt_txtime(s);
		if (ret)
			return 1;
	}

	ret = setup_time();
	if (ret)
		return 1;

	while (running) {
		frame.flags = 0;

		if (count && (--count == 0))
			running = 0;

		if (canfd) {
			mtu = CANFD_MTU;
			maxdlen = CANFD_MAX_DLEN;
			if (brs)
				frame.flags |= CANFD_BRS;
			if (esi)
				frame.flags |= CANFD_ESI;
		} else {
			mtu = CAN_MTU;
			maxdlen = CAN_MAX_DLEN;
		}

		if (id_mode == MODE_RANDOM)
			frame.can_id = random();
		else if (id_mode == MODE_RANDOM_EVEN)
			frame.can_id = random() & ~0x1;
		else if (id_mode == MODE_RANDOM_ODD)
			frame.can_id = random() | 0x1;

		if (extended) {
			frame.can_id &= CAN_EFF_MASK;
			frame.can_id |= CAN_EFF_FLAG;
		} else
			frame.can_id &= CAN_SFF_MASK;

		if (rtr_frame && !canfd)
			frame.can_id |= CAN_RTR_FLAG;

		if (dlc_mode == MODE_RANDOM) {
			if (canfd)
				frame.len = can_fd_dlc2len(random() & 0xF);
			else {
				frame.len = random() & 0xF;

				if (frame.len > CAN_MAX_DLEN) {
					/* generate Classic CAN len8 DLCs? */
					if (len8_dlc)
						ccf->len8_dlc = frame.len;

					frame.len = 8; /* for about 50% of the frames */
				} else {
					ccf->len8_dlc = 0;
				}
			}
		}

		if (data_mode == MODE_INCREMENT && !frame.len)
			frame.len = 1; /* min dlc value for incr. data */

		if (data_mode == MODE_RANDOM) {
			rnd = random();
			memcpy(&frame.data[0], &rnd, 4);
			rnd = random();
			memcpy(&frame.data[4], &rnd, 4);

			/* omit extra random number generation for CAN FD */
			if (canfd && frame.len > 8) {
				memcpy(&frame.data[8], &frame.data[0], 8);
				memcpy(&frame.data[16], &frame.data[0], 16);
				memcpy(&frame.data[32], &frame.data[0], 32);
			}
		}

		if (data_mode == MODE_FIX)
			memcpy(frame.data, fixdata, CANFD_MAX_DLEN);

		/* set unused payload data to zero like the CAN driver does it on rx */
		if (frame.len < maxdlen)
			memset(&frame.data[frame.len], 0, maxdlen - frame.len);

		if (!use_so_txtime &&
		    (ts.tv_sec || ts.tv_nsec) &&
		    burst_sent_count >= burst_count) {
			if (clock_nanosleep_flags == TIMER_ABSTIME)
				ts = timespec_add(ts, ts_gap);

			ret = clock_nanosleep(clockid, clock_nanosleep_flags, &ts, NULL);
			if (ret != 0 && ret != EINTR) {
				perror("clock_nanosleep");
				return 1;
			}
		}

		if (verbose) {
			printf("  %s  ", argv[optind]);

			if (verbose > 1)
				fprint_long_canframe(stdout, &frame, "\n", (verbose > 2) ? 1 : 0, maxdlen);
			else
				fprint_canframe(stdout, &frame, "\n", 1, maxdlen);
		}

		ret = do_send_one(s, &frame, mtu, polltimeout);
		if (ret)
			return 1;

		if (burst_sent_count >= burst_count)
			burst_sent_count = 0;
		burst_sent_count++;

		if (id_mode == MODE_INCREMENT)
			frame.can_id++;

		if (dlc_mode == MODE_INCREMENT) {
			incdlc++;
			incdlc %= CAN_MAX_RAW_DLC + 1;

			if (canfd && !mix)
				frame.len = can_fd_dlc2len(incdlc);
			else if (len8_dlc) {
				if (incdlc > CAN_MAX_DLEN) {
					frame.len = CAN_MAX_DLEN;
					ccf->len8_dlc = incdlc;
				} else {
					frame.len = incdlc;
					ccf->len8_dlc = 0;
				}
			} else {
				incdlc %= CAN_MAX_DLEN + 1;
				frame.len = incdlc;
			}
		}

		if (data_mode == MODE_INCREMENT) {
			incdata++;

			for (i = 0; i < 8; i++)
				frame.data[i] = incdata >> i * 8;
		}

		if (mix) {
			i = random();
			extended = i & 1;
			canfd = i & 2;
			if (canfd) {
				brs = i & 4;
				esi = i & 8;
			}
			rtr_frame = ((i & 24) == 24); /* reduce RTR frames to 1/4 */
		}
	}

	if (enobufs_count)
		printf("\nCounted %llu ENOBUFS return values on write().\n\n",
		       enobufs_count);

	close(s);

	return 0;
}